

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmStateSnapshot::GetBuildsystemDirectoryParent
          (cmStateSnapshot *__return_storage_ptr__,cmStateSnapshot *this)

{
  cmState *state;
  bool bVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  cmStateSnapshot local_58;
  iterator local_40;
  undefined1 local_30 [8];
  PositionType parentPos;
  cmStateSnapshot *this_local;
  
  cmStateSnapshot(__return_storage_ptr__,(cmState *)0x0);
  if (this->State != (cmState *)0x0) {
    join_0x00000010_0x00000000_ =
         cmLinkedTree<cmStateDetail::SnapshotDataType>::Root(&this->State->SnapshotData);
    bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                      (&this->Position,join_0x00000010_0x00000000_);
    if (!bVar1) {
      pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
      local_30 = (undefined1  [8])(pSVar2->DirectoryParent).Tree;
      parentPos.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(pSVar2->DirectoryParent).Position;
      local_40 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Root(&this->State->SnapshotData);
      bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=
                        ((iterator *)local_30,local_40);
      if (bVar1) {
        state = this->State;
        pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                           ((iterator *)local_30);
        pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&pSVar2->BuildSystemDirectory);
        cmStateSnapshot(&local_58,state,pBVar3->CurrentScope);
        __return_storage_ptr__->State = local_58.State;
        (__return_storage_ptr__->Position).Tree = local_58.Position.Tree;
        (__return_storage_ptr__->Position).Position = local_58.Position.Position;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmStateSnapshot::GetBuildsystemDirectoryParent() const
{
  cmStateSnapshot snapshot;
  if (!this->State || this->Position == this->State->SnapshotData.Root()) {
    return snapshot;
  }
  cmStateDetail::PositionType parentPos = this->Position->DirectoryParent;
  if (parentPos != this->State->SnapshotData.Root()) {
    snapshot = cmStateSnapshot(this->State,
                               parentPos->BuildSystemDirectory->CurrentScope);
  }

  return snapshot;
}